

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O0

int __thiscall
DiskBuilder::SaveDisk
          (DiskBuilder *this,char *file_path,IDisk *disk,char *format,
          ILoadingProgress *loading_progress)

{
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  undefined4 extraout_var;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_48;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_40;
  iterator it;
  ILoadingProgress *loading_progress_local;
  char *format_local;
  IDisk *disk_local;
  char *file_path_local;
  DiskBuilder *this_local;
  
  it._M_current = (FormatType **)loading_progress;
  local_40._M_current =
       (FormatType **)
       std::vector<FormatType_*,_std::allocator<FormatType_*>_>::begin(&this->format_list_);
  while( true ) {
    local_48._M_current =
         (FormatType **)
         std::vector<FormatType_*,_std::allocator<FormatType_*>_>::end(&this->format_list_);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) {
      return -1;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
              ::operator*(&local_40);
    iVar2 = (**(*ppFVar3)->_vptr_FormatType)();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),format);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>::
    operator++(&local_40,0);
  }
  ppFVar3 = __gnu_cxx::
            __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
            ::operator*(&local_40);
  iVar2 = (*(*ppFVar3)->_vptr_FormatType[9])(*ppFVar3,file_path,disk,it._M_current);
  return iVar2;
}

Assistant:

int DiskBuilder::SaveDisk(const char* file_path, IDisk* disk, const char* format, ILoadingProgress* loading_progress)
{
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if (strcmp((*it)->GetFormatName(), format) == 0)
      {
         return (*it)->SaveDisk(file_path, disk, loading_progress);;
      }
   }
   return -1;
}